

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuleParser.cpp
# Opt level: O0

void __thiscall Refal2::CRuleParser::AddToken(CRuleParser *this)

{
  bool bVar1;
  long *plVar2;
  code *local_30;
  CRuleParser *this_local;
  
  bVar1 = CParsingElementState::IsFinished
                    (&(this->super_CQualifierParser).super_CParsingElementState);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    CError::SetToken((CError *)this,&(this->super_CQualifierParser).token);
    local_30 = (code *)this->state;
    plVar2 = (long *)((long)&(this->super_CQualifierParser).super_CModuleBuilder.
                             super_CProgramBuilder.super_CFunctionBuilder.super_CVariablesBuilder.
                             super_CErrorsHelper.super_CError + *(long *)&this->field_0x1e80);
    if (((ulong)local_30 & 1) != 0) {
      local_30 = *(code **)(local_30 + *plVar2 + -1);
    }
    (*local_30)(plVar2);
    CError::ResetToken((CError *)this);
    return;
  }
  __assert_fail("!IsFinished()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/RuleParser.cpp"
                ,0x3e,"void Refal2::CRuleParser::AddToken()");
}

Assistant:

void CRuleParser::AddToken()
{
	assert( !IsFinished() );
	CError::SetToken( token );
	( this->*state )();
	CError::ResetToken();
}